

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void copy_suite::copy_real(void)

{
  undefined1 *puVar1;
  basic_variable<std::allocator<char>_> *this;
  undefined1 local_198 [29];
  undefined1 local_17b;
  undefined1 local_17a [2];
  undefined1 local_178 [8];
  variable copy_2;
  variable data_2;
  longdouble value_2;
  undefined1 local_fb;
  undefined1 local_fa [2];
  undefined1 local_f8 [8];
  variable copy_1;
  variable data_1;
  double value_1;
  undefined1 local_87;
  undefined1 local_86 [14];
  undefined1 local_78 [8];
  variable copy;
  variable data;
  undefined4 local_c [2];
  float value;
  
  local_c[0] = 0x40400000;
  puVar1 = &copy.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)puVar1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_86[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_78);
  local_87 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x65e,"void copy_suite::copy_real()",local_86,&local_87);
  value_1._4_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                 ((basic_variable<std::allocator<char>_> *)local_78);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("copy.value<float>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x65f,"void copy_suite::copy_real()",(long)&value_1 + 4,local_c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy.storage.field_0x28);
  data_1.storage._40_8_ = 0x4008000000000000;
  puVar1 = &copy_1.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)puVar1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_f8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_fa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_f8);
  local_fb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x665,"void copy_suite::copy_real()",local_fa,&local_fb);
  register0x00001200 =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                 ((basic_variable<std::allocator<char>_> *)local_f8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("copy.value<double>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x666,"void copy_suite::copy_real()",(long)&value_2 + 8,&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_1.storage.field_0x28);
  register0x00001100 = (longdouble)3.0;
  puVar1 = &copy_2.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)puVar1,register0x00001100);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_178,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_17a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_178);
  local_17b = 1;
  this = (basic_variable<std::allocator<char>_> *)0x184318;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x66c,"void copy_suite::copy_real()",local_17a,&local_17b);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_178,this);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("copy.value<long double>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x66d,"void copy_suite::copy_real()",local_198,&data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_2.storage.field_0x28);
  return;
}

Assistant:

void copy_real()
{
    {
        float value = 3.0f;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<float>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<float>(), value);
    }
    {
        double value = 3.0;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<double>(), value);
    }
    {
        long double value = 3.0L;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<long double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<long double>(), value);
    }
}